

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O1

void __thiscall QLineEdit::initStyleOption(QLineEdit *this,QStyleOptionFrame *option)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  QStyle *pQVar4;
  QRect QVar5;
  
  if (option != (QStyleOptionFrame *)0x0) {
    lVar2 = *(long *)&(this->super_QWidget).field_0x8;
    QStyleOption::initFrom(&option->super_QStyleOption,&this->super_QWidget);
    QVar5 = QWidget::contentsRect(&this->super_QWidget);
    (option->super_QStyleOption).rect = QVar5;
    iVar3 = 0;
    if ((*(byte *)(lVar2 + 0x27c) & 1) != 0) {
      pQVar4 = QWidget::style(&this->super_QWidget);
      iVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,5,option,this);
    }
    option->lineWidth = iVar3;
    option->midLineWidth = 0;
    uVar1 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
            super_QFlagsStorage<QStyle::StateFlag>.i;
    (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i = uVar1 | 4;
    if ((*(byte *)(*(long *)(lVar2 + 600) + 0x50) & 4) != 0) {
      (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i = uVar1 | 0x2000004;
    }
    (option->features).super_QFlagsStorageHelper<QStyleOptionFrame::FrameFeature,_4>.
    super_QFlagsStorage<QStyleOptionFrame::FrameFeature>.i = 0;
  }
  return;
}

Assistant:

void QLineEdit::initStyleOption(QStyleOptionFrame *option) const
{
    if (!option)
        return;

    Q_D(const QLineEdit);
    option->initFrom(this);
    option->rect = contentsRect();
    option->lineWidth = d->frame ? style()->pixelMetric(QStyle::PM_DefaultFrameWidth, option, this)
                                 : 0;
    option->midLineWidth = 0;
    option->state |= QStyle::State_Sunken;
    if (d->control->isReadOnly())
        option->state |= QStyle::State_ReadOnly;
#ifdef QT_KEYPAD_NAVIGATION
    if (hasEditFocus())
        option->state |= QStyle::State_HasEditFocus;
#endif
    option->features = QStyleOptionFrame::None;
}